

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O0

void arrays(void)

{
  rtosc_print_options shortline;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  rtosc_print_options *in_stack_fffffffffffffff8;
  
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  make_print_options((rtosc_print_options *)&stack0xffffffffffffffe8,true,3," ",0xc,1);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  check((char *)shortline._0_8_,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
        in_stack_ffffffffffffffec);
  return;
}

Assistant:

void arrays()
{
    check("[0 1 2]", NULL, "simple integer array", __LINE__);
    check("[]", NULL, "empty array", __LINE__);

    auto shortline = make_print_options(true, 3, " ", 12, true);
    // TODO: arrays with strings print newline positions wrong
    //       write *one* generic function rtosc_insert_newlines?
    check("[\"123\" \"45\" \"\"\\\n    \"6\"]", &shortline,
          "array with linebreak", __LINE__);

    check("[1 2 3] ['a' 'b'] [] [\"Hello World\"]", NULL,
          "Consecutive arrays", __LINE__);

    check("[[0 1] [] [2 3]]", NULL, "arrays inside arrays", __LINE__);

    check("[true false]", NULL, "true and false have the same type", __LINE__);

    check("[0.00 (0x0p+0) 0.07 (0x1.242124p-4) 0.07 (0x1.242124p-4) ... ]",
          NULL, "array of floats", __LINE__);
}